

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O2

void __thiscall
FShaderProgram::Compile
          (FShaderProgram *this,ShaderType type,char *name,FString *code,char *defines,
          int maxGlslVersion)

{
  ShaderType type_00;
  GLuint GVar1;
  FString patchedCode;
  FShaderProgram local_60;
  GLint status;
  char *local_50;
  char *local_48;
  int lengths [1];
  char *sources [1];
  
  local_60.mShaders[1] = maxGlslVersion;
  local_48 = defines;
  type_00 = (*_ptrc_glCreateShader)(type == Fragment ^ 0x8b31);
  this->mShaders[type] = type_00;
  local_50 = name;
  FString::FString(&patchedCode,name);
  FGLDebug::LabelObject(0x82e1,type_00,&patchedCode);
  FString::~FString(&patchedCode);
  PatchShader((FShaderProgram *)&patchedCode,type_00,code,local_48,local_60.mShaders[1]);
  lengths[0] = *(int *)(patchedCode.Chars + -0xc);
  sources[0] = patchedCode.Chars;
  (*_ptrc_glShaderSource)(this->mShaders[type],1,sources,lengths);
  (*_ptrc_glCompileShader)(this->mShaders[type]);
  status = 0;
  GVar1 = 0x8b81;
  (*_ptrc_glGetShaderiv)(this->mShaders[type],0x8b81,&status);
  if (status == 0) {
    GetShaderInfoLog(&local_60,GVar1);
    I_FatalError("Compile Shader \'%s\':\n%s\n",local_50,local_60._0_8_);
    FString::~FString((FString *)&local_60);
  }
  else {
    GVar1 = this->mProgram;
    if (GVar1 == 0) {
      GVar1 = (*_ptrc_glCreateProgram)();
      this->mProgram = GVar1;
    }
    (*_ptrc_glAttachShader)(GVar1,this->mShaders[type]);
  }
  FString::~FString(&patchedCode);
  return;
}

Assistant:

void FShaderProgram::Compile(ShaderType type, const char *name, const FString &code, const char *defines, int maxGlslVersion)
{
	CreateShader(type);

	const auto &handle = mShaders[type];

	FGLDebug::LabelObject(GL_SHADER, handle, name);

	FString patchedCode = PatchShader(type, code, defines, maxGlslVersion);
	int lengths[1] = { (int)patchedCode.Len() };
	const char *sources[1] = { patchedCode.GetChars() };
	glShaderSource(handle, 1, sources, lengths);

	glCompileShader(handle);

	GLint status = 0;
	glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
	if (status == GL_FALSE)
	{
		I_FatalError("Compile Shader '%s':\n%s\n", name, GetShaderInfoLog(handle).GetChars());
	}
	else
	{
		if (mProgram == 0)
			mProgram = glCreateProgram();
		glAttachShader(mProgram, handle);
	}
}